

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomCustomWidgets::write(DomCustomWidgets *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  DomCustomWidget **ppDVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomCustomWidget *v;
  QList<DomCustomWidget_*> *__range1;
  char16_t *str;
  const_iterator __end1;
  const_iterator __begin1;
  DataPointer *in_stack_ffffffffffffff18;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff20;
  DomCustomWidget *this_00;
  QString *in_stack_ffffffffffffff28;
  QAnyStringView *pQVar3;
  QAnyStringView *str_00;
  undefined1 local_78 [24];
  DomCustomWidget **local_60;
  const_iterator local_58;
  const_iterator local_50;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  bVar1 = QString::isEmpty((QString *)0x1a2129);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"customwidgets",0xd);
    QString::QString((QString *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    QString::toLower((QString *)in_stack_ffffffffffffff18);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_ffffffffffffff28);
  QXmlStreamWriter::writeStartElement(str_00);
  QString::~QString((QString *)0x1a21dc);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff20);
  }
  __n_00 = 0xaaaaaaaaaaaaaaaa;
  local_50.i = (DomCustomWidget **)0xaaaaaaaaaaaaaaaa;
  local_50 = QList<DomCustomWidget_*>::begin((QList<DomCustomWidget_*> *)in_stack_ffffffffffffff20);
  local_58.i = (DomCustomWidget **)0xaaaaaaaaaaaaaaaa;
  local_58 = QList<DomCustomWidget_*>::end((QList<DomCustomWidget_*> *)in_stack_ffffffffffffff20);
  while( true ) {
    local_60 = local_58.i;
    bVar1 = QList<DomCustomWidget_*>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar1) break;
    ppDVar2 = QList<DomCustomWidget_*>::const_iterator::operator*(&local_50);
    this_00 = *ppDVar2;
    pQVar3 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    DomCustomWidget::write(this_00,(int)pQVar3,local_78,__n_00);
    QString::~QString((QString *)0x1a22d9);
    QList<DomCustomWidget_*>::const_iterator::operator++(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomCustomWidgets::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("customwidgets") : tagName.toLower());

    for (DomCustomWidget *v : m_customWidget)
        v->write(writer, u"customwidget"_s);

    writer.writeEndElement();
}